

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O1

string * __thiscall
absl::Substitute_abi_cxx11_(string *__return_storage_ptr__,absl *this,string_view format,Arg *a0)

{
  size_t in_R9;
  string_view format_00;
  undefined8 local_28;
  undefined8 uStack_20;
  
  format_00._M_len = format._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28 = *(undefined8 *)format._M_str;
  uStack_20 = *(undefined8 *)(format._M_str + 8);
  format_00._M_str = (char *)&local_28;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)this,format_00,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0) {
  std::string result;
  SubstituteAndAppend(&result, format, a0);
  return result;
}